

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.c
# Opt level: O1

void move_print(Board *board,Move *move,_Bool indent)

{
  byte bVar1;
  Spot *pSVar2;
  Spot *pSVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  char buf [1024];
  
  if (move->type == MULTIPLE) {
    pSVar2 = (Spot *)0x0;
  }
  else {
    pSVar2 = board_spotGet(board,move->fromSpotType,move->fromSpotIndex);
  }
  if (move->type < MOVEDISTRIBUTE) {
    pSVar3 = board_spotGet(board,move->toSpotType,move->toSpotIndex);
  }
  else {
    pSVar3 = (Spot *)0x0;
  }
  uVar10 = 0;
  if ((pSVar2 != (Spot *)0x0) &&
     (uVar10 = (ulong)(uint)move->fromSpotCardIndex, move->fromSpotCardIndex == 0xffffffff)) {
    uVar10 = (ulong)(pSVar2->cardsCount - 1);
  }
  if (pSVar3 == (Spot *)0x0) {
    uVar9 = 0;
  }
  else {
    uVar9 = move->toSpotCardIndex;
    if (uVar9 == 0xffffffff) {
      uVar9 = pSVar3->cardsCount - 1;
    }
  }
  bVar11 = true;
  if ((pSVar3 != (Spot *)0x0) && (pSVar3->cardsCount != '\0')) {
    bVar11 = pSVar3->cards[uVar9 & 0xff] == (Card *)0x0;
  }
  uVar8 = (uint)move->type;
  if (move->type == MOVE) {
    if (pSVar2 != (Spot *)0x0) goto LAB_00106be0;
  }
  else if (uVar8 == 1 && pSVar2 != (Spot *)0x0) {
LAB_00106be0:
    pcVar4 = cards_print((Card **)((ulong)(((uint)uVar10 & 0xff) * 8) + (long)pSVar2->cards),
                         pSVar2->cardsCount - (char)uVar10,false);
    if (bVar11) {
      pcVar5 = "TOP";
    }
    else {
      pcVar5 = cards_print((Card **)((ulong)((uVar9 & 0xff) * 8) + (long)pSVar3->cards),
                           pSVar3->cardsCount - (char)uVar9,false);
    }
    sprintf(buf,"%s => %s",pcVar4,pcVar5);
    uVar9 = 0x20;
    if (indent) {
      uVar9 = 9;
    }
    pcVar4 = spot_name(move->fromSpotType);
    bVar1 = move->fromSpotIndex;
    uVar8 = move->fromSpotCardIndex;
    pcVar5 = spot_name(move->toSpotType);
    pcVar6 = "";
    if (move->type == MOVEREVERSED) {
      pcVar6 = "(reversed)";
    }
    printf("%c          MOVE %10s%02d %2d => %10s%02d   %2d %s (%s)\n",(ulong)uVar9,pcVar4,
           (ulong)bVar1,(ulong)uVar8,pcVar5,(ulong)move->toSpotIndex,
           (ulong)(uint)move->toSpotCardIndex,pcVar6,buf);
    return;
  }
  if (pSVar2 != (Spot *)0x0 && uVar8 == 2) {
    pcVar4 = spot_name(move->fromSpotType);
    bVar1 = move->fromSpotIndex;
    uVar9 = move->fromSpotCardIndex;
    pcVar5 = spot_name(move->toSpotType);
    uVar7 = 0x20;
    if (indent) {
      uVar7 = 9;
    }
    printf("%cMOVEDISTRIBUTE %10s%02d %2d => %10s0-%02d %2d (",uVar7,pcVar4,(ulong)bVar1,
           (ulong)uVar9,pcVar5,(ulong)(move->toSpotIndex - 1),(ulong)(uint)move->toSpotCardIndex);
    buf[0] = '\0';
    if (move->toSpotIndex != '\0') {
      uVar10 = uVar10 & 0xff;
      uVar9 = 0;
      do {
        if (uVar9 != 0) {
          printf(", ");
        }
        pSVar3 = board_spotGet(board,move->toSpotType,(uchar)uVar9);
        pcVar4 = card_print(pSVar2->cards[uVar10],false);
        pcVar5 = "TOP";
        if (pSVar3->cardsCount != 0) {
          pcVar5 = card_print(pSVar3->cards[pSVar3->cardsCount - 1],false);
        }
        printf("%s => %s",pcVar4,pcVar5);
        uVar9 = uVar9 + 1;
        uVar10 = uVar10 - 1;
      } while (uVar9 < move->toSpotIndex);
    }
    puts(")");
    return;
  }
  if (uVar8 != 3) {
    pcVar4 = spot_name(move->fromSpotType);
    bVar1 = move->fromSpotIndex;
    uVar9 = move->fromSpotCardIndex;
    pcVar5 = spot_name(move->toSpotType);
    printf("Unknown or invalid formatted move %d %s-%d:%d %s-%d:%d\n",(ulong)uVar8,pcVar4,
           (ulong)bVar1,(ulong)uVar9,pcVar5,(ulong)move->toSpotIndex,
           (ulong)(uint)move->toSpotCardIndex);
    return;
  }
  uVar7 = 0x20;
  if (indent) {
    uVar7 = 9;
  }
  printf("%c      MULTIPLE\n",uVar7);
  movePack_print(board,move->movePack,true);
  return;
}

Assistant:

void move_print(Board * board, Move * move, bool indent)
{
	char buf[1024];
	Spot * fromSpot = (move->type==MULTIPLE ? 0 : board_spotGet(board, move->fromSpotType, move->fromSpotIndex));
	Spot * toSpot = (move->type==MOVE || move->type==MOVEREVERSED ? board_spotGet(board, move->toSpotType, move->toSpotIndex) : 0);
	unsigned char fromSpotCardIndex = (fromSpot==0 ? 0 : (move->fromSpotCardIndex==-1 ? (fromSpot->cardsCount-1) : move->fromSpotCardIndex));
	unsigned char toSpotCardIndex = (toSpot==0 ? 0 : (move->toSpotCardIndex==-1 ? (toSpot->cardsCount-1) : move->toSpotCardIndex));
	unsigned char i=0;
	Card * toCard = (toSpot==0 ? 0 : (toSpot->cardsCount==0 ? 0 : toSpot->cards[toSpotCardIndex]));

	if((move->type==MOVE || move->type==MOVEREVERSED) && fromSpot)
	{
		sprintf(buf, "%s => %s", cards_print(&fromSpot->cards[fromSpotCardIndex], fromSpot->cardsCount-fromSpotCardIndex, false), toCard==0 ? "TOP" : cards_print(&toSpot->cards[toSpotCardIndex], toSpot->cardsCount-toSpotCardIndex, false));
		printf("%c          MOVE %10s%02d %2d => %10s%02d   %2d %s (%s)\n", (indent ? '\t' : ' '), spot_name(move->fromSpotType), move->fromSpotIndex, move->fromSpotCardIndex, spot_name(move->toSpotType), move->toSpotIndex, move->toSpotCardIndex, move->type==MOVEREVERSED ? "(reversed)" : "", buf);	
	}
	else if(move->type==MOVEDISTRIBUTE && fromSpot)
	{
		printf("%cMOVEDISTRIBUTE %10s%02d %2d => %10s0-%02d %2d (", (indent ? '\t' : ' '), spot_name(move->fromSpotType), move->fromSpotIndex, move->fromSpotCardIndex, spot_name(move->toSpotType), move->toSpotIndex-1, move->toSpotCardIndex);

		buf[0] = 0;
		for(i=0;i<move->toSpotIndex;i++)
		{
			if(i>0)
				printf(", ");

			toSpot = board_spotGet(board, move->toSpotType, i);
			printf("%s => %s", card_print(fromSpot->cards[(fromSpotCardIndex-i)], false), toSpot->cardsCount==0 ? "TOP" : (card_print(toSpot->cards[(toSpot->cardsCount-1)], false)));
		}
		printf(")\n");
	}
	else if(move->type==MULTIPLE)
	{
		printf("%c      MULTIPLE\n", (indent ? '\t' : ' '));
		movePack_print(board, move->movePack, true);
	}
	else
	{
		printf("Unknown or invalid formatted move %d %s-%d:%d %s-%d:%d\n", move->type, spot_name(move->fromSpotType), move->fromSpotIndex, move->fromSpotCardIndex, spot_name(move->toSpotType), move->toSpotIndex, move->toSpotCardIndex);
	}
}